

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O0

void __thiscall xmrig::Network::setJob(Network *this,IClient *client,Job *job)

{
  undefined *puVar1;
  uint16_t uVar2;
  uint64_t uVar3;
  String *pSVar4;
  char *pcVar5;
  MinerPrivate *pMVar6;
  Job *in_RDX;
  long *in_RSI;
  Miner *in_RDI;
  Job *in_stack_ffffffffffffffd8;
  
  uVar3 = Job::height(in_RDX);
  puVar1 = tag;
  if (uVar3 == 0) {
    (**(code **)(*in_RSI + 0x50))();
    pSVar4 = Pool::host((Pool *)0x2365ac);
    pcVar5 = String::data(pSVar4);
    (**(code **)(*in_RSI + 0x50))();
    uVar2 = Pool::port((Pool *)0x2365cc);
    uVar3 = Job::diff(in_RDX);
    Log::print(INFO,
               "%s \x1b[1;35mnew job\x1b[0m from \x1b[1;37m%s:%d\x1b[0m diff \x1b[1;37m%lu\x1b[0m",
               puVar1,pcVar5,(ulong)uVar2,uVar3);
  }
  else {
    (**(code **)(*in_RSI + 0x50))();
    pSVar4 = Pool::host((Pool *)0x236520);
    pcVar5 = String::data(pSVar4);
    (**(code **)(*in_RSI + 0x50))();
    uVar2 = Pool::port((Pool *)0x236540);
    in_stack_ffffffffffffffd8 = (Job *)Job::diff(in_RDX);
    uVar3 = Job::height(in_RDX);
    Log::print(INFO,
               "%s \x1b[1;35mnew job\x1b[0m from \x1b[1;37m%s:%d\x1b[0m diff \x1b[1;37m%lu\x1b[0m height \x1b[1;37m%lu\x1b[0m"
               ,puVar1,pcVar5,(ulong)uVar2,in_stack_ffffffffffffffd8,uVar3);
  }
  pMVar6 = (MinerPrivate *)Job::diff(in_RDX);
  in_RDI[0xc].d_ptr = pMVar6;
  Controller::miner((Controller *)in_RDI[1].super_IBaseListener._vptr_IBaseListener);
  Miner::setJob(in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void xmrig::Network::setJob(IClient *client, const Job &job)
{
    if (job.height()) {
        LOG_INFO("%s " MAGENTA_BOLD("new job") " from " WHITE_BOLD("%s:%d") " diff " WHITE_BOLD("%" PRIu64) " height " WHITE_BOLD("%" PRIu64),
                 tag, client->pool().host().data(), client->pool().port(), job.diff(), job.height());
    }
    else {
        LOG_INFO("%s " MAGENTA_BOLD("new job") " from " WHITE_BOLD("%s:%d") " diff " WHITE_BOLD("%" PRIu64),
                 tag, client->pool().host().data(), client->pool().port(), job.diff());
    }

    m_state.diff = job.diff();
    m_controller->miner()->setJob(job);
}